

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Population *p)

{
  ostream *poVar1;
  string pType;
  string pCov;
  string pVel;
  string pSafe;
  string pSize;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  local_58 = local_48;
  local_50 = 0;
  local_78 = local_68;
  local_70 = 0;
  local_48[0] = 0;
  local_68[0] = 0;
  local_98 = local_88;
  local_90 = 0;
  local_b8 = local_a8;
  local_b0 = 0;
  local_88[0] = 0;
  local_a8[0] = 0;
  if ((p->type == HERBIVORE) || (p->type == CARNIVORE)) {
    std::__cxx11::string::assign((char *)&local_b8);
  }
  if (p->size < (VERY_BIG|SMALL)) {
    std::__cxx11::string::assign((char *)&local_38);
  }
  if (p->safety < (VERY_BIG|SMALL)) {
    std::__cxx11::string::assign((char *)&local_58);
  }
  if (p->velocity < (VERY_BIG|SMALL)) {
    std::__cxx11::string::assign((char *)&local_78);
  }
  if (p->cover < (VERY_BIG|SMALL)) {
    std::__cxx11::string::assign((char *)&local_98);
  }
  poVar1 = std::operator<<(os,(string *)&local_b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&p->name);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"animalAmount ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->animalAmount);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"health       ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->health);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"productivity ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->productivity);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"biologyDev   ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->biologyDev);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"safety       ");
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"velocity     ");
  poVar1 = std::operator<<(poVar1,(string *)&local_78);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"cover        ");
  poVar1 = std::operator<<(poVar1,(string *)&local_98);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"xPos         ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->xPos);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"yPos         ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p->yPos);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,"MUTATIONS");
  std::endl<char,std::char_traits<char>>(poVar1);
  CompoundMutation::getMutation(&p->mutationTree);
  CompoundMutation::print(&p->mutationTree,os);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Population &p) {
  std::string pSize, pSafe, pVel, pCov, pType;
  switch (p.GetType()) {
    case Population::HERBIVORE:pType = "HERBIVORE";
      break;
    case Population::CARNIVORE:pType = "CARNIVORE";
      break;
  }

  switch (p.GetSize()) {
    case Population::VERY_SMALL:pSize = "VERY_SMALL";
      break;
    case Population::SMALL:pSize = "SMALL";
      break;
    case Population::AVERAGE:pSize = "AVERAGE";
      break;
    case Population::BIG:pSize = "BIG";
      break;
    case Population::VERY_BIG:pSize = "VERY_BIG";
      break;
  }

  switch (p.GetSafety()) {
    case Population::VERY_SMALL:pSafe = "VERY_SMALL";
      break;
    case Population::SMALL:pSafe = "SMALL";
      break;
    case Population::AVERAGE:pSafe = "AVERAGE";
      break;
    case Population::BIG:pSafe = "BIG";
      break;
    case Population::VERY_BIG:pSafe = "VERY_BIG";
      break;
  }

  switch (p.GetVelocity()) {
    case Population::VERY_SMALL:pVel = "VERY_SMALL";
      break;
    case Population::SMALL:pVel = "SMALL";
      break;
    case Population::AVERAGE:pVel = "AVERAGE";
      break;
    case Population::BIG:pVel = "BIG";
      break;
    case Population::VERY_BIG:pVel = "VERY_BIG";
      break;
  }

  switch (p.GetCover()) {
    case Population::VERY_SMALL:pCov = "VERY_SMALL";
      break;
    case Population::SMALL:pCov = "SMALL";
      break;
    case Population::AVERAGE:pCov = "AVERAGE";
      break;
    case Population::BIG:pCov = "BIG";
      break;
    case Population::VERY_BIG:pCov = "VERY_BIG";
      break;
  }
  os << pType << " " << pSize << " " << p.GetName() << "\n"
     << "animalAmount " << p.GetAnimalAmount() << "\n"
     << "health       " << p.GetHealth() << "\n"
     << "productivity " << p.GetProductivity() << "\n"
     << "biologyDev   " << p.GetBiologyDev() << "\n"
     << "safety       " << pSafe << "\n"
     << "velocity     " << pVel << "\n"
     << "cover        " << pCov << "\n"
     << "xPos         " << p.GetXPos() << "\n"
     << "yPos         " << p.GetYPos() << "\n";
  os << "MUTATIONS" << std::endl;
  p.mutationTree.getMutation();
  p.mutationTree.print(os);
  return os;
}